

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_server.cpp
# Opt level: O2

string * __thiscall
my_lsp_server::lscpp_handle_did_open_abi_cxx11_
          (string *__return_storage_ptr__,my_lsp_server *this,server *param_1,
          DidOpenTextDocumentParams *param_2)

{
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"opened",&local_31);
  lscpp::experimental::make_notification_message(__return_storage_ptr__,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

auto
  lscpp_handle_did_open(server &, lscpp::protocol::DidOpenTextDocumentParams) {
    return lscpp::experimental::make_notification_message("opened");
  }